

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O3

mz_bool mz_zip_validate_file(mz_zip_archive *pZip,mz_uint file_index,mz_uint flags)

{
  byte bVar1;
  byte bVar2;
  mz_zip_internal_state *pmVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  undefined4 *puVar8;
  undefined4 *puVar9;
  mz_bool mVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  size_t sVar14;
  size_t sVar15;
  ulong min_new_capacity;
  size_t sVar16;
  uint uVar17;
  uint uVar18;
  mz_zip_error mVar19;
  mz_uint8 *pCentral_dir_header;
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  short *psVar25;
  bool bVar26;
  bool bVar27;
  mz_uint8 descriptor_buf [32];
  mz_uint32 uncomp_crc32;
  mz_bool found_zip64_ext_data_in_cdir;
  mz_uint32 local_header_u32 [8];
  mz_zip_archive_file_stat file_stat;
  ulong local_550;
  uint local_540;
  ulong local_538;
  uint local_528;
  undefined4 local_524;
  undefined4 local_520;
  undefined4 local_51c;
  undefined4 local_518;
  undefined4 local_514;
  ulong local_500;
  uint local_4f8 [2];
  ulong local_4f0;
  mz_zip_array local_4e8;
  int local_4c8;
  byte local_4c2;
  uint local_4ba;
  uint local_4b6;
  uint local_4b2;
  ushort local_4ae;
  ushort local_4ac;
  short *local_4a0;
  mz_uint64 local_498;
  long local_490;
  mz_zip_archive_file_stat local_488;
  
  local_4f8[1] = 0;
  local_4f8[0] = 0;
  local_4e8.m_capacity = 0;
  local_4e8.m_p = (short *)0x0;
  local_4e8.m_size = 0;
  local_4e8.m_element_size = 1;
  local_4e8._28_4_ = 0;
  if (pZip == (mz_zip_archive *)0x0) {
    return 0;
  }
  pmVar3 = pZip->m_pState;
  if ((((pmVar3 == (mz_zip_internal_state *)0x0) || (pZip->m_pAlloc == (mz_alloc_func)0x0)) ||
      (pZip->m_pFree == (mz_free_func)0x0)) || (pZip->m_pRead == (mz_file_read_func)0x0)) {
LAB_0011c937:
    pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    return 0;
  }
  if (pZip->m_total_files < file_index) goto LAB_0011c937;
  if (file_index < pZip->m_total_files) {
    pCentral_dir_header =
         (mz_uint8 *)
         ((ulong)*(uint *)((long)(pmVar3->m_central_dir_offsets).m_p + (ulong)file_index * 4) +
         (long)(pmVar3->m_central_dir).m_p);
  }
  else {
    pCentral_dir_header = (mz_uint8 *)0x0;
  }
  mVar10 = mz_zip_file_stat_internal
                     (pZip,file_index,pCentral_dir_header,&local_488,(mz_bool *)(local_4f8 + 1));
  if (mVar10 == 0) {
    return 0;
  }
  if (local_488.m_is_directory != 0) {
    return 1;
  }
  if (local_488.m_uncomp_size == 0) {
    return 1;
  }
  if (local_488.m_is_encrypted != 0) {
    pZip->m_last_error = MZ_ZIP_UNSUPPORTED_ENCRYPTION;
    return 0;
  }
  if ((local_488.m_method & 0xfff7) != 0) {
    pZip->m_last_error = MZ_ZIP_UNSUPPORTED_METHOD;
    return 0;
  }
  if (local_488.m_is_supported == 0) {
    pZip->m_last_error = MZ_ZIP_UNSUPPORTED_FEATURE;
    return 0;
  }
  sVar14 = (*pZip->m_pRead)(pZip->m_pIO_opaque,local_488.m_local_header_ofs,&local_4c8,0x1e);
  if (sVar14 != 0x1e) {
    pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
    return 0;
  }
  if (local_4c8 != 0x4034b50) {
LAB_0011caa0:
    pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
    return 0;
  }
  uVar20 = (ulong)local_4ae;
  local_540 = (uint)local_4ac;
  local_538 = (ulong)local_4b6;
  local_500 = (ulong)local_4b2;
  sVar15 = strlen(local_488.m_filename);
  if (sVar15 != uVar20) goto LAB_0011caa0;
  local_498 = local_488.m_local_header_ofs + uVar20 + 0x1e;
  local_4f0 = (ulong)local_540;
  local_490 = local_498 + local_4f0;
  if (pZip->m_archive_size < local_488.m_comp_size + local_490) goto LAB_0011caa0;
  min_new_capacity = (ulong)local_540;
  if (local_540 < local_4ae) {
    min_new_capacity = uVar20;
  }
  if (((int)min_new_capacity != 0) &&
     (mVar10 = mz_zip_array_ensure_capacity(pZip,&local_4e8,min_new_capacity,0), mVar10 == 0)) {
    pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
    goto LAB_0011cf9c;
  }
  if (uVar20 == 0) {
LAB_0011cb62:
    psVar25 = (short *)local_4e8.m_p;
    if ((local_540 != 0) && ((local_4b6 == 0xffffffff || ((int)local_500 == -1)))) {
      sVar14 = (*pZip->m_pRead)(pZip->m_pIO_opaque,local_498,local_4e8.m_p,local_4f0);
      if (sVar14 != local_4f0) goto LAB_0011cea8;
      do {
        if (local_540 < 4) {
LAB_0011cf94:
          pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
          goto LAB_0011cf9c;
        }
        uVar13 = (ushort)psVar25[1] + 4;
        if (local_540 < uVar13) goto LAB_0011cf94;
        if (*psVar25 == 1) {
          if ((ushort)psVar25[1] < 0x10) goto LAB_0011cf94;
          local_500 = *(ulong *)(psVar25 + 2);
          local_538 = *(ulong *)(psVar25 + 6);
          bVar27 = true;
          goto LAB_0011cb87;
        }
        psVar25 = (short *)((long)psVar25 + (ulong)uVar13);
        local_540 = local_540 - uVar13;
      } while (local_540 != 0);
    }
    bVar27 = false;
LAB_0011cb87:
    if ((((local_4c2 & 8) != 0) && (local_538 == 0)) && (local_4ba == 0)) {
      sVar14 = 0x18;
      if (!bVar27) {
        sVar14 = (ulong)(pmVar3->m_zip64 != 0) * 8 + 0x10;
      }
      sVar16 = (*pZip->m_pRead)(pZip->m_pIO_opaque,local_490 + local_488.m_comp_size,&local_528,
                                sVar14);
      mVar19 = MZ_ZIP_FILE_READ_FAILED;
      if (sVar16 == sVar14) {
        bVar26 = local_528 != 0x8074b50;
        uVar21 = local_524 >> 8 & 0xff;
        uVar13 = local_524;
        if (!bVar26) {
          uVar13 = local_520;
        }
        uVar17 = local_520 >> 8 & 0xff;
        uVar22 = uVar21;
        if (!bVar26) {
          uVar22 = uVar17;
        }
        bVar1 = local_520._2_1_;
        if (bVar26) {
          bVar1 = local_524._2_1_;
        }
        bVar2 = local_520._3_1_;
        if (bVar26) {
          bVar2 = local_524._3_1_;
        }
        uVar4 = local_520;
        if (!bVar26) {
          uVar4 = local_51c;
        }
        uVar12 = (uint)local_51c._1_1_;
        if (bVar26) {
          uVar12 = uVar17;
        }
        uVar17 = local_528 >> 0x18;
        if (local_528 == 0x8074b50) {
          uVar17 = (uint)local_524._3_1_;
        }
        uVar5 = local_528 >> 0x10;
        if (local_528 == 0x8074b50) {
          uVar5 = (uint)local_524._2_1_;
        }
        uVar23 = local_528 >> 8;
        uVar7 = local_528;
        if (local_528 == 0x8074b50) {
          uVar23 = uVar21;
          uVar7 = local_524;
        }
        local_550 = (ulong)((uint)bVar2 << 0x18 | (uint)bVar1 << 0x10 | uVar22 << 8 | uVar13 & 0xff)
        ;
        if ((bool)(~bVar27 & pmVar3->m_zip64 == 0)) {
          puVar8 = &local_520;
          if (local_528 == 0x8074b50) {
            puVar8 = &local_51c;
          }
          puVar9 = &local_520;
          if (local_528 == 0x8074b50) {
            puVar9 = &local_51c;
          }
          uVar20 = (ulong)((uint)*(byte *)((long)puVar9 + 3) << 0x18 |
                          (uint)*(byte *)((long)puVar8 + 2) << 0x10 | uVar12 << 8) +
                   (ulong)(uVar4 & 0xff);
        }
        else {
          bVar27 = local_528 == 0x8074b50;
          if (bVar27) {
            local_520._2_1_ = local_51c._2_1_;
          }
          uVar20 = (ulong)local_520._3_1_;
          uVar13 = local_51c >> 0x18;
          uVar21 = local_51c;
          if (bVar27) {
            uVar20 = (ulong)uVar13;
            uVar21 = local_518;
          }
          if (bVar27) {
            local_51c._1_1_ = local_518._1_1_;
          }
          uVar18 = local_518 >> 0x10 & 0xff;
          uVar22 = (uint)local_51c._2_1_;
          if (bVar27) {
            uVar22 = uVar18;
          }
          uVar6 = local_518;
          if (bVar27) {
            uVar6 = local_514;
            uVar13 = local_518 >> 0x18;
          }
          bVar1 = local_514._1_1_;
          if (!bVar27) {
            bVar1 = local_518._1_1_;
          }
          uVar24 = local_514 >> 0x10 & 0xff;
          if (!bVar27) {
            uVar24 = uVar18;
          }
          local_500 = (ulong)local_514._3_1_;
          if (!bVar27) {
            local_500 = (ulong)(local_518 >> 0x18);
          }
          local_550 = local_550 +
                      ((ulong)(uVar4 & 0xff) << 0x20 | (ulong)uVar12 << 0x28 |
                       (ulong)local_520._2_1_ << 0x30 | uVar20 << 0x38);
          uVar20 = CONCAT44(uVar6,uVar13 << 0x18 |
                                  uVar22 << 0x10 | (uint)local_51c._1_1_ << 8 | uVar21 & 0xff) &
                   0xffffffffff | (ulong)bVar1 << 0x28 | (ulong)uVar24 << 0x30 | local_500 << 0x38;
        }
        mVar19 = MZ_ZIP_VALIDATION_FAILED;
        if ((((uVar17 << 0x18 | (uVar5 & 0xff) << 0x10 | (uVar23 & 0xff) << 8 | uVar7 & 0xff) ==
              local_488.m_crc32) && (local_550 == local_488.m_comp_size)) &&
           (uVar20 == local_488.m_uncomp_size)) goto LAB_0011cf23;
      }
      pZip->m_last_error = mVar19;
      goto LAB_0011cf9c;
    }
    if (((local_4ba == local_488.m_crc32) && (local_538 == local_488.m_comp_size)) &&
       (local_500 == local_488.m_uncomp_size)) {
LAB_0011cf23:
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_4e8.m_p);
      if ((flags >> 0xd & 1) != 0) {
        return 1;
      }
      mVar10 = mz_zip_reader_extract_to_callback
                         (pZip,file_index,mz_zip_compute_crc32_callback,local_4f8,0);
      if (mVar10 != 0) {
        if (local_4f8[0] != local_488.m_crc32) {
          pZip->m_last_error = MZ_ZIP_VALIDATION_FAILED;
          return 0;
        }
        return 1;
      }
      return 0;
    }
  }
  else {
    local_4a0 = (short *)local_4e8.m_p;
    sVar14 = (*pZip->m_pRead)(pZip->m_pIO_opaque,local_488.m_local_header_ofs + 0x1e,local_4e8.m_p,
                              uVar20);
    if (sVar14 != uVar20) {
LAB_0011cea8:
      pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
      goto LAB_0011cf9c;
    }
    iVar11 = bcmp(local_488.m_filename,local_4a0,uVar20);
    if (iVar11 == 0) goto LAB_0011cb62;
  }
  pZip->m_last_error = MZ_ZIP_VALIDATION_FAILED;
LAB_0011cf9c:
  (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_4e8.m_p);
  return 0;
}

Assistant:

mz_bool mz_zip_validate_file(mz_zip_archive *pZip, mz_uint file_index, mz_uint flags)
{
    mz_zip_archive_file_stat file_stat;
    mz_zip_internal_state *pState;
    const mz_uint8 *pCentral_dir_header;
    mz_bool found_zip64_ext_data_in_cdir = MZ_FALSE;
    mz_bool found_zip64_ext_data_in_ldir = MZ_FALSE;
    mz_uint32 local_header_u32[(MZ_ZIP_LOCAL_DIR_HEADER_SIZE + sizeof(mz_uint32) - 1) / sizeof(mz_uint32)];
    mz_uint8 *pLocal_header = (mz_uint8 *)local_header_u32;
    mz_uint64 local_header_ofs = 0;
    mz_uint32 local_header_filename_len, local_header_extra_len, local_header_crc32;
    mz_uint64 local_header_comp_size, local_header_uncomp_size;
    mz_uint32 uncomp_crc32 = MZ_CRC32_INIT;
    mz_bool has_data_descriptor;
    mz_uint32 local_header_bit_flags;

    mz_zip_array file_data_array;
    mz_zip_array_init(&file_data_array, 1);

    if ((!pZip) || (!pZip->m_pState) || (!pZip->m_pAlloc) || (!pZip->m_pFree) || (!pZip->m_pRead))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    if (file_index > pZip->m_total_files)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    pState = pZip->m_pState;

    pCentral_dir_header = mz_zip_get_cdh(pZip, file_index);

    if (!mz_zip_file_stat_internal(pZip, file_index, pCentral_dir_header, &file_stat, &found_zip64_ext_data_in_cdir))
        return MZ_FALSE;

    /* A directory or zero length file */
    if ((file_stat.m_is_directory) || (!file_stat.m_uncomp_size))
        return MZ_TRUE;

    /* Encryption and patch files are not supported. */
    if (file_stat.m_is_encrypted)
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_ENCRYPTION);

    /* This function only supports stored and deflate. */
    if ((file_stat.m_method != 0) && (file_stat.m_method != MZ_DEFLATED))
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_METHOD);

    if (!file_stat.m_is_supported)
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_FEATURE);

    /* Read and parse the local directory entry. */
    local_header_ofs = file_stat.m_local_header_ofs;
    if (pZip->m_pRead(pZip->m_pIO_opaque, local_header_ofs, pLocal_header, MZ_ZIP_LOCAL_DIR_HEADER_SIZE) != MZ_ZIP_LOCAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);

    if (MZ_READ_LE32(pLocal_header) != MZ_ZIP_LOCAL_DIR_HEADER_SIG)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    local_header_filename_len = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_FILENAME_LEN_OFS);
    local_header_extra_len = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_EXTRA_LEN_OFS);
    local_header_comp_size = MZ_READ_LE32(pLocal_header + MZ_ZIP_LDH_COMPRESSED_SIZE_OFS);
    local_header_uncomp_size = MZ_READ_LE32(pLocal_header + MZ_ZIP_LDH_DECOMPRESSED_SIZE_OFS);
    local_header_crc32 = MZ_READ_LE32(pLocal_header + MZ_ZIP_LDH_CRC32_OFS);
    local_header_bit_flags = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_BIT_FLAG_OFS);
    has_data_descriptor = (local_header_bit_flags & 8) != 0;

    if (local_header_filename_len != strlen(file_stat.m_filename))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    if ((local_header_ofs + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + local_header_filename_len + local_header_extra_len + file_stat.m_comp_size) > pZip->m_archive_size)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    if (!mz_zip_array_resize(pZip, &file_data_array, MZ_MAX(local_header_filename_len, local_header_extra_len), MZ_FALSE))
    {
        mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        goto handle_failure;
    }

    if (local_header_filename_len)
    {
        if (pZip->m_pRead(pZip->m_pIO_opaque, local_header_ofs + MZ_ZIP_LOCAL_DIR_HEADER_SIZE, file_data_array.m_p, local_header_filename_len) != local_header_filename_len)
        {
            mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
            goto handle_failure;
        }

        /* I've seen 1 archive that had the same pathname, but used backslashes in the local dir and forward slashes in the central dir. Do we care about this? For now, this case will fail validation. */
        if (memcmp(file_stat.m_filename, file_data_array.m_p, local_header_filename_len) != 0)
        {
            mz_zip_set_error(pZip, MZ_ZIP_VALIDATION_FAILED);
            goto handle_failure;
        }
    }

    if ((local_header_extra_len) && ((local_header_comp_size == MZ_UINT32_MAX) || (local_header_uncomp_size == MZ_UINT32_MAX)))
    {
        mz_uint32 extra_size_remaining = local_header_extra_len;
        const mz_uint8 *pExtra_data = (const mz_uint8 *)file_data_array.m_p;

        if (pZip->m_pRead(pZip->m_pIO_opaque, local_header_ofs + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + local_header_filename_len, file_data_array.m_p, local_header_extra_len) != local_header_extra_len)
        {
            mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
            goto handle_failure;
        }

        do
        {
            mz_uint32 field_id, field_data_size, field_total_size;

            if (extra_size_remaining < (sizeof(mz_uint16) * 2))
            {
                mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
                goto handle_failure;
            }

            field_id = MZ_READ_LE16(pExtra_data);
            field_data_size = MZ_READ_LE16(pExtra_data + sizeof(mz_uint16));
            field_total_size = field_data_size + sizeof(mz_uint16) * 2;

            if (field_total_size > extra_size_remaining)
            {
                mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
                goto handle_failure;
            }

            if (field_id == MZ_ZIP64_EXTENDED_INFORMATION_FIELD_HEADER_ID)
            {
                const mz_uint8 *pSrc_field_data = pExtra_data + sizeof(mz_uint32);

                if (field_data_size < sizeof(mz_uint64) * 2)
                {
                    mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
                    goto handle_failure;
                }

                local_header_uncomp_size = MZ_READ_LE64(pSrc_field_data);
                local_header_comp_size = MZ_READ_LE64(pSrc_field_data + sizeof(mz_uint64));

                found_zip64_ext_data_in_ldir = MZ_TRUE;
                break;
            }

            pExtra_data += field_total_size;
            extra_size_remaining -= field_total_size;
        } while (extra_size_remaining);
    }

    /* TODO: parse local header extra data when local_header_comp_size is 0xFFFFFFFF! (big_descriptor.zip) */
    /* I've seen zips in the wild with the data descriptor bit set, but proper local header values and bogus data descriptors */
    if ((has_data_descriptor) && (!local_header_comp_size) && (!local_header_crc32))
    {
        mz_uint8 descriptor_buf[32];
        mz_bool has_id;
        const mz_uint8 *pSrc;
        mz_uint32 file_crc32;
        mz_uint64 comp_size = 0, uncomp_size = 0;

        mz_uint32 num_descriptor_uint32s = ((pState->m_zip64) || (found_zip64_ext_data_in_ldir)) ? 6 : 4;

        if (pZip->m_pRead(pZip->m_pIO_opaque, local_header_ofs + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + local_header_filename_len + local_header_extra_len + file_stat.m_comp_size, descriptor_buf, sizeof(mz_uint32) * num_descriptor_uint32s) != (sizeof(mz_uint32) * num_descriptor_uint32s))
        {
            mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
            goto handle_failure;
        }

        has_id = (MZ_READ_LE32(descriptor_buf) == MZ_ZIP_DATA_DESCRIPTOR_ID);
        pSrc = has_id ? (descriptor_buf + sizeof(mz_uint32)) : descriptor_buf;

        file_crc32 = MZ_READ_LE32(pSrc);

        if ((pState->m_zip64) || (found_zip64_ext_data_in_ldir))
        {
            comp_size = MZ_READ_LE64(pSrc + sizeof(mz_uint32));
            uncomp_size = MZ_READ_LE64(pSrc + sizeof(mz_uint32) + sizeof(mz_uint64));
        }
        else
        {
            comp_size = MZ_READ_LE32(pSrc + sizeof(mz_uint32));
            uncomp_size = MZ_READ_LE32(pSrc + sizeof(mz_uint32) + sizeof(mz_uint32));
        }

        if ((file_crc32 != file_stat.m_crc32) || (comp_size != file_stat.m_comp_size) || (uncomp_size != file_stat.m_uncomp_size))
        {
            mz_zip_set_error(pZip, MZ_ZIP_VALIDATION_FAILED);
            goto handle_failure;
        }
    }
    else
    {
        if ((local_header_crc32 != file_stat.m_crc32) || (local_header_comp_size != file_stat.m_comp_size) || (local_header_uncomp_size != file_stat.m_uncomp_size))
        {
            mz_zip_set_error(pZip, MZ_ZIP_VALIDATION_FAILED);
            goto handle_failure;
        }
    }

    mz_zip_array_clear(pZip, &file_data_array);

    if ((flags & MZ_ZIP_FLAG_VALIDATE_HEADERS_ONLY) == 0)
    {
        if (!mz_zip_reader_extract_to_callback(pZip, file_index, mz_zip_compute_crc32_callback, &uncomp_crc32, 0))
            return MZ_FALSE;

        /* 1 more check to be sure, although the extract checks too. */
        if (uncomp_crc32 != file_stat.m_crc32)
        {
            mz_zip_set_error(pZip, MZ_ZIP_VALIDATION_FAILED);
            return MZ_FALSE;
        }
    }

    return MZ_TRUE;

handle_failure:
    mz_zip_array_clear(pZip, &file_data_array);
    return MZ_FALSE;
}